

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFileSpecObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper
          (QPDFFileSpecObjectHelper *this,QPDFObjectHandle *oh)

{
  bool bVar1;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,(QPDFObjectHandle *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFFileSpecObjectHelper_002b06a0;
  (this->m).super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m).super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = QPDFObjectHandle::isDictionary(oh);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/Filespec",&local_71);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_72);
    bVar1 = QPDFObjectHandle::isDictionaryOfType(oh,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Embedded file object\'s type is not /Filespec",
               (allocator<char> *)&local_50);
    QPDFObjectHandle::warnIfPossible(oh,&local_70);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Embedded file object is not a dictionary",
               (allocator<char> *)&local_50);
    QPDFObjectHandle::warnIfPossible(oh,&local_70);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper(QPDFObjectHandle oh) :
    QPDFObjectHelper(oh)
{
    if (!oh.isDictionary()) {
        oh.warnIfPossible("Embedded file object is not a dictionary");
        return;
    }
    if (!oh.isDictionaryOfType("/Filespec")) {
        oh.warnIfPossible("Embedded file object's type is not /Filespec");
    }
}